

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# python_generator.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::python::Generator::FixOptionsForField
          (Generator *this,FieldDescriptor *field)

{
  Descriptor *pDVar1;
  bool bVar2;
  string field_name;
  string field_options;
  allocator<char> local_99;
  string local_98;
  string local_78;
  string local_58;
  string local_38;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_98,"FieldOptions",(allocator<char> *)&local_78);
  MessageLite::SerializeAsString_abi_cxx11_(&local_58,*(MessageLite **)(field + 0x80));
  OptionsValue(&local_38,this,&local_98,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_98);
  bVar2 = std::operator!=(&local_38,"None");
  if (!bVar2) goto LAB_0026f30b;
  local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
  local_98._M_string_length = 0;
  local_98.field_2._M_local_buf[0] = '\0';
  if (field[0x50] == (FieldDescriptor)0x1) {
    pDVar1 = *(Descriptor **)(field + 0x68);
    if (pDVar1 != (Descriptor *)0x0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_78,"extensions_by_name",&local_99);
      FieldReferencingExpression(&local_58,this,pDVar1,field,&local_78);
      goto LAB_0026f2ca;
    }
    std::__cxx11::string::_M_assign((string *)&local_98);
  }
  else {
    pDVar1 = *(Descriptor **)(field + 0x58);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_78,"fields_by_name",&local_99);
    FieldReferencingExpression(&local_58,this,pDVar1,field,&local_78);
LAB_0026f2ca:
    std::__cxx11::string::operator=((string *)&local_98,(string *)&local_58);
    std::__cxx11::string::~string((string *)&local_58);
    std::__cxx11::string::~string((string *)&local_78);
  }
  anon_unknown_0::PrintDescriptorOptionsFixingCode(&local_98,&local_38,this->printer_);
  std::__cxx11::string::~string((string *)&local_98);
LAB_0026f30b:
  std::__cxx11::string::~string((string *)&local_38);
  return;
}

Assistant:

void Generator::FixOptionsForField(
    const FieldDescriptor& field) const {
  string field_options = OptionsValue(
      "FieldOptions", field.options().SerializeAsString());
  if (field_options != "None") {
    string field_name;
    if (field.is_extension()) {
      if (field.extension_scope() == NULL) {
        // Top level extensions.
        field_name = field.name();
      } else {
        field_name = FieldReferencingExpression(
            field.extension_scope(), field, "extensions_by_name");
      }
    } else {
      field_name = FieldReferencingExpression(
          field.containing_type(), field, "fields_by_name");
    }
    PrintDescriptorOptionsFixingCode(field_name, field_options, printer_);
  }
}